

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_read.c
# Opt level: O0

int main(int argc,char **args)

{
  light_pcapng p_Var1;
  char *__ptr;
  long in_RSI;
  int in_EDI;
  char *data;
  light_pcapng pcapng;
  char *file;
  int i;
  light_pcapng pcapng_00;
  undefined4 in_stack_ffffffffffffffe8;
  int iVar2;
  
  for (iVar2 = 1; iVar2 < in_EDI; iVar2 = iVar2 + 1) {
    pcapng_00 = *(light_pcapng *)(in_RSI + (long)iVar2 * 8);
    p_Var1 = light_read_from_path((char *)CONCAT44(iVar2,in_stack_ffffffffffffffe8));
    if (p_Var1 == (light_pcapng)0x0) {
      fprintf(_stderr,"Unable to read pcapng: %s\n",pcapng_00);
    }
    else {
      __ptr = light_pcapng_to_string((light_pcapng)args);
      printf("Data for %s\n%s\n",pcapng_00,__ptr);
      light_pcapng_release(pcapng_00);
      free(__ptr);
    }
  }
  return 0;
}

Assistant:

int main(int argc, const char **args) {
	int i;

	for (i = 1; i < argc; ++i) {
		const char *file = args[i];
		light_pcapng pcapng = light_read_from_path(file);
		if (pcapng != NULL) {
			char *data = light_pcapng_to_string(pcapng);
			printf("Data for %s\n%s\n", file, data);
			light_pcapng_release(pcapng);
			free(data);
		}
		else {
			fprintf(stderr, "Unable to read pcapng: %s\n", file);
		}
	}

	return 0;
}